

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_color.c
# Opt level: O0

void TIFFYCbCrtoRGB(TIFFYCbCrToRGB *ycbcr,uint32_t Y,int32_t Cb,int32_t Cr,uint32_t *r,uint32_t *g,
                   uint32_t *b)

{
  uint32_t local_60;
  uint32_t local_5c;
  uint32_t local_58;
  uint32_t local_54;
  uint32_t local_50;
  uint32_t local_4c;
  int32_t local_48;
  int local_44;
  int32_t local_40;
  int local_3c;
  uint local_38;
  int32_t i;
  uint32_t *g_local;
  uint32_t *r_local;
  int32_t Cr_local;
  int32_t Cb_local;
  uint32_t Y_local;
  TIFFYCbCrToRGB *ycbcr_local;
  
  local_38 = Y;
  if (0xff < Y) {
    local_38 = 0xff;
  }
  if (Cb < 0) {
    local_3c = 0;
  }
  else {
    local_40 = Cb;
    if (0xff < Cb) {
      local_40 = 0xff;
    }
    local_3c = local_40;
  }
  if (Cr < 0) {
    local_44 = 0;
  }
  else {
    local_48 = Cr;
    if (0xff < Cr) {
      local_48 = 0xff;
    }
    local_44 = local_48;
  }
  local_50 = ycbcr->Y_tab[local_38] + ycbcr->Cr_r_tab[local_44];
  if ((int)local_50 < 0) {
    local_4c = 0;
  }
  else {
    if (0xff < (int)local_50) {
      local_50 = 0xff;
    }
    local_4c = local_50;
  }
  *r = local_4c;
  local_58 = ycbcr->Y_tab[local_38] +
             (ycbcr->Cb_g_tab[local_3c] + ycbcr->Cr_g_tab[local_44] >> 0x10);
  if ((int)local_58 < 0) {
    local_54 = 0;
  }
  else {
    if (0xff < (int)local_58) {
      local_58 = 0xff;
    }
    local_54 = local_58;
  }
  *g = local_54;
  local_60 = ycbcr->Y_tab[local_38] + ycbcr->Cb_b_tab[local_3c];
  if ((int)local_60 < 0) {
    local_5c = 0;
  }
  else {
    if (0xff < (int)local_60) {
      local_60 = 0xff;
    }
    local_5c = local_60;
  }
  *b = local_5c;
  return;
}

Assistant:

void TIFFYCbCrtoRGB(TIFFYCbCrToRGB *ycbcr, uint32_t Y, int32_t Cb, int32_t Cr,
                    uint32_t *r, uint32_t *g, uint32_t *b)
{
    int32_t i;

    /* XXX: Only 8-bit YCbCr input supported for now */
    Y = HICLAMP(Y, 255);
    Cb = CLAMP(Cb, 0, 255);
    Cr = CLAMP(Cr, 0, 255);

    i = ycbcr->Y_tab[Y] + ycbcr->Cr_r_tab[Cr];
    *r = CLAMP(i, 0, 255);
    i = ycbcr->Y_tab[Y] +
        (int)((ycbcr->Cb_g_tab[Cb] + ycbcr->Cr_g_tab[Cr]) >> SHIFT);
    *g = CLAMP(i, 0, 255);
    i = ycbcr->Y_tab[Y] + ycbcr->Cb_b_tab[Cb];
    *b = CLAMP(i, 0, 255);
}